

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TgTypeParser.cpp
# Opt level: O1

string * __thiscall
TgBot::TgTypeParser::parseUpdate_abi_cxx11_
          (string *__return_storage_ptr__,TgTypeParser *this,Ptr *object)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  element_type *peVar3;
  pointer pcVar4;
  undefined8 uVar5;
  size_type sVar6;
  TgTypeParser *this_00;
  char *pcVar7;
  char cVar8;
  string *psVar9;
  string local_70;
  string local_50;
  
  peVar3 = (object->super___shared_ptr<TgBot::Update,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  if (peVar3 == (element_type *)0x0) {
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  }
  else {
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    cVar8 = (char)__return_storage_ptr__;
    std::__cxx11::string::push_back(cVar8);
    paVar1 = &local_70.field_2;
    local_70._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"update_id","");
    std::__cxx11::string::push_back(cVar8);
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_70._M_dataplus._M_p)
    ;
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    std::__cxx11::string::push_back(cVar8);
    std::__cxx11::string::push_back(cVar8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != paVar1) {
      operator_delete(local_70._M_dataplus._M_p);
    }
    local_70._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"message","");
    psVar9 = &local_50;
    parseMessage_abi_cxx11_
              (psVar9,this,
               &((object->super___shared_ptr<TgBot::Update,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
                message);
    appendToJson((TgTypeParser *)psVar9,__return_storage_ptr__,&local_70,&local_50);
    paVar2 = &local_50.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != paVar2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != paVar1) {
      operator_delete(local_70._M_dataplus._M_p);
    }
    local_70._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"edited_message","");
    psVar9 = &local_50;
    parseMessage_abi_cxx11_
              (psVar9,this,
               &((object->super___shared_ptr<TgBot::Update,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
                editedMessage);
    appendToJson((TgTypeParser *)psVar9,__return_storage_ptr__,&local_70,&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != paVar2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != paVar1) {
      operator_delete(local_70._M_dataplus._M_p);
    }
    local_70._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"channel_post","");
    psVar9 = &local_50;
    parseMessage_abi_cxx11_
              (psVar9,this,
               &((object->super___shared_ptr<TgBot::Update,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
                channelPost);
    appendToJson((TgTypeParser *)psVar9,__return_storage_ptr__,&local_70,&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != paVar2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != paVar1) {
      operator_delete(local_70._M_dataplus._M_p);
    }
    local_70._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"edited_channel_post","");
    psVar9 = &local_50;
    parseMessage_abi_cxx11_
              (psVar9,this,
               &((object->super___shared_ptr<TgBot::Update,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
                editedChannelPost);
    appendToJson((TgTypeParser *)psVar9,__return_storage_ptr__,&local_70,&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != paVar2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != paVar1) {
      operator_delete(local_70._M_dataplus._M_p);
    }
    this_00 = (TgTypeParser *)0x2604bd;
    local_70._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"inline_query","");
    psVar9 = &local_50;
    parseInlineQuery_abi_cxx11_
              (psVar9,this_00,
               &((object->super___shared_ptr<TgBot::Update,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
                inlineQuery);
    appendToJson((TgTypeParser *)psVar9,__return_storage_ptr__,&local_70,&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != paVar2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != paVar1) {
      operator_delete(local_70._M_dataplus._M_p);
    }
    pcVar7 = "chosen_inline_result";
    local_70._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"chosen_inline_result","");
    psVar9 = &local_50;
    parseChosenInlineResult_abi_cxx11_
              (psVar9,(TgTypeParser *)pcVar7,
               &((object->super___shared_ptr<TgBot::Update,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
                chosenInlineResult);
    appendToJson((TgTypeParser *)psVar9,__return_storage_ptr__,&local_70,&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != paVar2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != paVar1) {
      operator_delete(local_70._M_dataplus._M_p);
    }
    local_70._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"callback_query","");
    psVar9 = &local_50;
    parseCallbackQuery_abi_cxx11_
              (psVar9,this,
               &((object->super___shared_ptr<TgBot::Update,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
                callbackQuery);
    appendToJson((TgTypeParser *)psVar9,__return_storage_ptr__,&local_70,&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != paVar2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != paVar1) {
      operator_delete(local_70._M_dataplus._M_p);
    }
    local_70._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"shipping_query","");
    psVar9 = &local_50;
    parseShippingQuery_abi_cxx11_
              (psVar9,this,
               &((object->super___shared_ptr<TgBot::Update,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
                shippingQuery);
    appendToJson((TgTypeParser *)psVar9,__return_storage_ptr__,&local_70,&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != paVar2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != paVar1) {
      operator_delete(local_70._M_dataplus._M_p);
    }
    pcVar7 = "pre_checkout_query";
    local_70._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"pre_checkout_query","");
    psVar9 = &local_50;
    parsePreCheckoutQuery_abi_cxx11_
              (psVar9,(TgTypeParser *)pcVar7,
               &((object->super___shared_ptr<TgBot::Update,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
                preCheckoutQuery);
    appendToJson((TgTypeParser *)psVar9,__return_storage_ptr__,&local_70,&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != paVar2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != paVar1) {
      operator_delete(local_70._M_dataplus._M_p);
    }
    sVar6 = __return_storage_ptr__->_M_string_length - 1;
    if (__return_storage_ptr__->_M_string_length == 0) {
      uVar5 = std::__throw_out_of_range_fmt
                        ("%s: __pos (which is %zu) > this->size() (which is %zu)",
                         "basic_string::erase");
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != paVar2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != paVar1) {
        operator_delete(local_70._M_dataplus._M_p);
      }
      pcVar4 = (__return_storage_ptr__->_M_dataplus)._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar4 != &__return_storage_ptr__->field_2) {
        operator_delete(pcVar4);
      }
      _Unwind_Resume(uVar5);
    }
    __return_storage_ptr__->_M_string_length = sVar6;
    (__return_storage_ptr__->_M_dataplus)._M_p[sVar6] = '\0';
    std::__cxx11::string::push_back(cVar8);
  }
  return __return_storage_ptr__;
}

Assistant:

string TgTypeParser::parseUpdate(const Update::Ptr& object) const {
    if (!object) {
        return "";
    }
    string result;
    result += '{';
    appendToJson(result, "update_id", object->updateId);
    appendToJson(result, "message", parseMessage(object->message));
    appendToJson(result, "edited_message", parseMessage(object->editedMessage));
    appendToJson(result, "channel_post", parseMessage(object->channelPost));
    appendToJson(result, "edited_channel_post", parseMessage(object->editedChannelPost));
    appendToJson(result, "inline_query", parseInlineQuery(object->inlineQuery));
    appendToJson(result, "chosen_inline_result", parseChosenInlineResult(object->chosenInlineResult));
    appendToJson(result, "callback_query", parseCallbackQuery(object->callbackQuery));
    appendToJson(result, "shipping_query", parseShippingQuery(object->shippingQuery));
    appendToJson(result, "pre_checkout_query", parsePreCheckoutQuery(object->preCheckoutQuery));
    removeLastComma(result);
    result += '}';
    return result;
}